

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

SQInteger __thiscall SQLexer::ReadString(SQLexer *this,SQInteger ndelim,bool verbatim,bool advance)

{
  sqvector<char,_unsigned_int> *this_00;
  byte bVar1;
  int iVar2;
  size_type sVar3;
  DiagnosticsId diagId;
  LexChar LVar4;
  ulong uVar5;
  long lVar6;
  SQInteger SVar7;
  SQChar temp [9];
  char local_39;
  SQChar *stemp;
  
  if ((ndelim == 0x22) || (this->_state != LS_TEMPALTE)) {
    this_00 = &this->_longstr;
    temp[0] = '\0';
    sqvector<char,_unsigned_int>::resize(this_00,0,temp);
    if (advance) {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
    }
    if (this->_currdata != '\0') {
      SVar7 = 0x103;
LAB_00130547:
      do {
        bVar1 = this->_currdata;
        if ((ulong)bVar1 == ndelim) {
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          if (this->_state == LS_TEMPALTE) {
            SVar7 = 0x153;
          }
          if ((!verbatim) || (this->_currdata != '\"')) {
LAB_001307ee:
            temp[0] = '\0';
            sqvector<char,_unsigned_int>::push_back(this_00,temp);
            if (ndelim != 0x27) {
              this->_svalue = (this->_longstr)._vals;
              return SVar7;
            }
            sVar3 = (this->_longstr)._size;
            if (sVar3 == 1) {
              diagId = DI_EMPTY_LITERAL;
            }
            else {
              if (sVar3 == 2) goto LAB_00130847;
              diagId = DI_TOO_LONG_LITERAL;
            }
            iVar2 = (int)this->_tokencolumn;
            SQCompilation::SQCompilationContext::reportDiagnostic
                      (this->_ctx,diagId,(int32_t)this->_tokenline,iVar2,
                       (int)this->_currentcolumn - iVar2);
LAB_00130847:
            this->_nvalue = (long)*(this->_longstr)._vals;
            return 0x104;
          }
LAB_001306c0:
          temp[0] = '\"';
          bVar1 = temp[0];
          goto LAB_001305e3;
        }
        if (bVar1 != 10) {
          if (bVar1 == 0x5c) {
            if (verbatim) {
LAB_00130578:
              temp[0] = '\\';
              bVar1 = temp[0];
            }
            else {
              Next(this);
              lVar6 = this->_currentcolumn + 1;
              this->_currentcolumn = lVar6;
              bVar1 = this->_currdata;
              switch(bVar1) {
              case 0x6e:
                temp[0] = '\n';
                bVar1 = temp[0];
                break;
              case 0x6f:
              case 0x70:
              case 0x71:
              case 0x73:
              case 0x77:
              case 0x79:
              case 0x7a:
              case 0x7c:
switchD_00130631_caseD_6f:
                iVar2 = (int)this->_tokencolumn;
                SQCompilation::SQCompilationContext::reportDiagnostic
                          (this->_ctx,DI_UNRECOGNISED_ESCAPER,(int32_t)this->_tokenline,iVar2,
                           (int)lVar6 - iVar2);
                goto LAB_00130547;
              case 0x72:
                temp[0] = '\r';
                bVar1 = temp[0];
                break;
              case 0x74:
                temp[0] = '\t';
                bVar1 = temp[0];
                break;
              case 0x75:
switchD_00130631_caseD_75:
                ProcessStringHexEscape(this,temp,(ulong)(bVar1 != 'u') * 4 + 4);
                uVar5 = strtoul(temp,&stemp,0x10);
                AddUTF8(this,uVar5);
                goto LAB_00130547;
              case 0x76:
                temp[0] = '\v';
                bVar1 = temp[0];
                break;
              case 0x78:
                ProcessStringHexEscape(this,(SQChar *)&stemp,2);
                uVar5 = strtoul((char *)&stemp,(char **)temp,0x10);
                local_39 = (char)uVar5;
                sqvector<char,_unsigned_int>::push_back(this_00,&local_39);
                goto LAB_00130547;
              case 0x7b:
              case 0x7d:
                if (this->_state != LS_TEMPALTE) goto switchD_00130631_caseD_6f;
                break;
              default:
                if (bVar1 == '\"') goto LAB_001306c0;
                if (bVar1 == '\'') {
                  temp[0] = '\'';
                  bVar1 = temp[0];
                }
                else if (bVar1 == '0') {
                  temp[0] = '\0';
                  bVar1 = temp[0];
                }
                else {
                  if (bVar1 == 'U') goto switchD_00130631_caseD_75;
                  if (bVar1 == '\\') goto LAB_00130578;
                  if (bVar1 == 'a') {
                    temp[0] = '\a';
                    bVar1 = temp[0];
                  }
                  else if (bVar1 == 'b') {
                    temp[0] = '\b';
                    bVar1 = temp[0];
                  }
                  else {
                    if (bVar1 != 'f') goto switchD_00130631_caseD_6f;
                    temp[0] = '\f';
                    bVar1 = temp[0];
                  }
                }
              }
            }
          }
          else if (bVar1 == 0x7b) {
            if (this->_state == LS_TEMPALTE) {
              temp[0] = '{';
              sqvector<char,_unsigned_int>::push_back(this_00,temp);
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              SVar7 = this->_expectedToken;
              goto LAB_001307ee;
            }
          }
          else if (bVar1 == 0) {
            iVar2 = (int)this->_tokencolumn;
            SQCompilation::SQCompilationContext::reportDiagnostic
                      (this->_ctx,DI_UNFINISHED_STRING,(int32_t)this->_tokenline,iVar2,
                       (int)this->_currentcolumn - iVar2);
            return -1;
          }
LAB_001305e3:
          temp[0] = bVar1;
          sqvector<char,_unsigned_int>::push_back(this_00,temp);
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          goto LAB_00130547;
        }
        LVar4 = '\n';
        if (!verbatim) {
          iVar2 = (int)this->_tokencolumn;
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (this->_ctx,DI_NEWLINE_IN_CONST,(int32_t)this->_tokenline,iVar2,
                     (int)this->_currentcolumn - iVar2);
          LVar4 = this->_currdata;
        }
        temp[0] = LVar4;
        sqvector<char,_unsigned_int>::push_back(this_00,temp);
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        nextLine(this);
      } while( true );
    }
  }
  else {
    iVar2 = (int)this->_tokencolumn;
    SQCompilation::SQCompilationContext::reportDiagnostic
              (this->_ctx,DI_EXPECTED_LEX,(int32_t)this->_tokenline,iVar2,
               (int)this->_currentcolumn - iVar2,"string");
  }
  return -1;
}

Assistant:

SQInteger SQLexer::ReadString(SQInteger ndelim,bool verbatim, bool advance)
{
    SQInteger t = TK_STRING_LITERAL;
    if (_state == LS_TEMPALTE && ndelim != _SC('\"')) {
        _ctx.reportDiagnostic(DiagnosticsId::DI_EXPECTED_LEX, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "string");
        return -1;
    }
    INIT_TEMP_STRING();
    if (advance)
      NEXT();
    if(IS_EOB()) return -1;
    for(;;) {
        while(CUR_CHAR != ndelim) {
            SQInteger x = CUR_CHAR;
            switch (x) {
            case SQUIRREL_EOB:
                _ctx.reportDiagnostic(DiagnosticsId::DI_UNFINISHED_STRING, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                return -1;
            case _SC('\n'):
                if(!verbatim)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_NEWLINE_IN_CONST, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                APPEND_CHAR(CUR_CHAR); NEXT();
                nextLine();
                break;
            case _SC('\\'):
                if(verbatim) {
                    APPEND_CHAR('\\'); NEXT();
                }
                else {
                    NEXT();
                    switch(CUR_CHAR) {
                    case _SC('x'):  {
                        const SQInteger maxdigits = sizeof(SQChar) * 2;
                        SQChar temp[maxdigits + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        APPEND_CHAR((SQChar)strtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('U'):
                    case _SC('u'):  {
                        const SQInteger maxdigits = CUR_CHAR == 'u' ? 4 : 8;
                        SQChar temp[8 + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        AddUTF8(strtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('t'): APPEND_CHAR(_SC('\t')); NEXT(); break;
                    case _SC('a'): APPEND_CHAR(_SC('\a')); NEXT(); break;
                    case _SC('b'): APPEND_CHAR(_SC('\b')); NEXT(); break;
                    case _SC('n'): APPEND_CHAR(_SC('\n')); NEXT(); break;
                    case _SC('r'): APPEND_CHAR(_SC('\r')); NEXT(); break;
                    case _SC('v'): APPEND_CHAR(_SC('\v')); NEXT(); break;
                    case _SC('f'): APPEND_CHAR(_SC('\f')); NEXT(); break;
                    case _SC('0'): APPEND_CHAR(_SC('\0')); NEXT(); break;
                    case _SC('\\'): APPEND_CHAR(_SC('\\')); NEXT(); break;
                    case _SC('"'): APPEND_CHAR(_SC('"')); NEXT(); break;
                    case _SC('\''): APPEND_CHAR(_SC('\'')); NEXT(); break;
                    case _SC('{'): case _SC('}'):
                        if (_state == LS_TEMPALTE) {
                          APPEND_CHAR(CUR_CHAR);
                          NEXT();
                          break;
                        }
                    // fall through -V796
                    default:
                        _ctx.reportDiagnostic(DiagnosticsId::DI_UNRECOGNISED_ESCAPER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                    break;
                    }
                }
                break;
            case _SC('{'):
                if (_state == LS_TEMPALTE) {
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                    assert(_expectedToken > 0);
                    t = _expectedToken;
                    goto loop_exit;
                }
            default:
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
        }
        NEXT();

        if (_state == LS_TEMPALTE)
          t = TK_TEMPLATE_SUFFIX;

        if(verbatim && CUR_CHAR == '"') { //double quotation
            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
        else {
            break;
        }
    }

loop_exit:
    TERMINATE_BUFFER();
    SQInteger len = _longstr.size()-1;
    if(ndelim == _SC('\'')) {
        assert(_state != LS_TEMPALTE);
        if(len == 0)
            _ctx.reportDiagnostic(DiagnosticsId::DI_EMPTY_LITERAL, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        if(len > 1)
            _ctx.reportDiagnostic(DiagnosticsId::DI_TOO_LONG_LITERAL, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        _nvalue = _longstr[0];
        return TK_INTEGER;
    }
    SetStringValue();
    return t;
}